

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  char *pcVar2;
  internal *piVar3;
  TimeInMillis ms;
  TimeInMillis ms_00;
  char *local_470;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  int local_1ec;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  undefined4 local_60;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string kTestsuite;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_suite_name_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"testcase",&local_49);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = TestInfo::is_in_another_shard(test_info);
  if (bVar1) {
    local_60 = 1;
  }
  else {
    std::operator<<(stream,"    <testcase");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"name",&local_81);
    pcVar2 = TestInfo::name(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar2,&local_a9);
    OutputXmlAttribute(stream,(string *)local_48,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    pcVar2 = TestInfo::value_param(test_info);
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"value_param",&local_d1);
      pcVar2 = TestInfo::value_param(test_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar2,&local_f9);
      OutputXmlAttribute(stream,(string *)local_48,&local_d0,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
    pcVar2 = TestInfo::type_param(test_info);
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"type_param",&local_121);
      pcVar2 = TestInfo::type_param(test_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar2,&local_149);
      OutputXmlAttribute(stream,(string *)local_48,&local_120,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"file",&local_171);
    pcVar2 = TestInfo::file(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar2,&local_199);
    OutputXmlAttribute(stream,(string *)local_48,&local_170,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"line",&local_1c1);
    local_1ec = TestInfo::line(test_info);
    StreamableToString<int>(&local_1e8,&local_1ec);
    OutputXmlAttribute(stream,(string *)local_48,&local_1c0,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"status",&local_211);
      bVar1 = TestInfo::should_run(test_info);
      pcVar2 = "notrun";
      if (bVar1) {
        pcVar2 = "run";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar2,&local_239);
      OutputXmlAttribute(stream,(string *)local_48,&local_210,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"result",&local_261);
      bVar1 = TestInfo::should_run(test_info);
      if (bVar1) {
        bVar1 = TestResult::Skipped((TestResult *)kTestsuite.field_2._8_8_);
        local_470 = "completed";
        if (bVar1) {
          local_470 = "skipped";
        }
      }
      else {
        local_470 = "suppressed";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,local_470,&local_289);
      OutputXmlAttribute(stream,(string *)local_48,&local_260,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"time",&local_2b1);
      piVar3 = (internal *)TestResult::elapsed_time((TestResult *)kTestsuite.field_2._8_8_);
      FormatTimeInMillisAsSeconds_abi_cxx11_(&local_2d8,piVar3,ms);
      OutputXmlAttribute(stream,(string *)local_48,&local_2b0,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"timestamp",&local_2f9);
      piVar3 = (internal *)TestResult::start_timestamp((TestResult *)kTestsuite.field_2._8_8_);
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_320,piVar3,ms_00);
      OutputXmlAttribute(stream,(string *)local_48,&local_2f8,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"classname",&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,test_suite_name,&local_369);
      OutputXmlAttribute(stream,(string *)local_48,&local_340,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
      OutputXmlTestResult(stream,(TestResult *)kTestsuite.field_2._8_8_);
      local_60 = 0;
    }
    else {
      std::operator<<(stream," />\n");
      local_60 = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
  OutputXmlAttribute(stream, kTestsuite, "line",
                     StreamableToString(test_info.line()));
  if (GTEST_FLAG_GET(list_tests)) {
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  OutputXmlTestResult(stream, result);
}